

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigSat.c
# Opt level: O2

void Fraig_VarsStudy(Fraig_Man_t *p,Fraig_Node_t *pOld,Fraig_Node_t *pNew)

{
  uint uVar1;
  int iVar2;
  
  p->nTravIds = p->nTravIds + 1;
  uVar1 = Fraig_MarkTfi_rec(p,pNew);
  printf("(%d)(%d,%d):",(ulong)uVar1,(ulong)(uint)pOld->Level,(ulong)(uint)pNew->Level);
  if (pOld->TravId == p->nTravIds) {
    printf("* ");
    return;
  }
  p->nTravIds = p->nTravIds + 1;
  uVar1 = Fraig_MarkTfi2_rec(p,pOld);
  printf("%d",(ulong)uVar1);
  p->nTravIds = p->nTravIds + 1;
  iVar2 = Fraig_MarkTfi3_rec(p,pNew);
  printf("%c ",(ulong)((uint)(iVar2 == 0) * 2 + 0x2b));
  return;
}

Assistant:

void Fraig_VarsStudy( Fraig_Man_t * p, Fraig_Node_t * pOld, Fraig_Node_t * pNew )
{
    int NumPis, NumCut, fContain;

    // mark the TFI of pNew
    p->nTravIds++;
    NumPis = Fraig_MarkTfi_rec( p, pNew );
    printf( "(%d)(%d,%d):", NumPis, pOld->Level, pNew->Level );

    // check if the old is in the TFI
    if ( pOld->TravId == p->nTravIds )
    {
        printf( "* " );
        return;
    }

    // count the boundary of nodes in pOld
    p->nTravIds++;
    NumCut = Fraig_MarkTfi2_rec( p, pOld );
    printf( "%d", NumCut );

    // check if the new is contained in the old's support
    p->nTravIds++;
    fContain = Fraig_MarkTfi3_rec( p, pNew );
    printf( "%c ", fContain? '+':'-' );
}